

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

void __thiscall spectest::JSONParser::PrintError(JSONParser *this,char *format,...)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  basic_string_view<char,_std::char_traits<char>_> *__t;
  FILE *__stream;
  string *this_00;
  allocator<char> *paVar4;
  size_t sVar5;
  char in_AL;
  int iVar6;
  undefined8 uVar7;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *__s;
  size_t __maxlen;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 uStack_200;
  char acStack_1f8 [8];
  basic_string_view<char,_std::char_traits<char>_> *local_1f0;
  FILE *local_1e8;
  string *local_1e0;
  allocator<char> *local_1d8;
  JSONParser *local_1d0;
  undefined1 local_1c8 [16];
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined4 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  allocator<char> local_109;
  string local_108 [32];
  long local_e8;
  size_t length;
  char *buffer;
  char fixed_buf [128];
  va_list args_copy;
  undefined4 uStack_38;
  undefined4 uStack_34;
  va_list args;
  char *format_local;
  JSONParser *this_local;
  
  __s = acStack_1f8;
  if (in_AL != '\0') {
    local_198 = in_XMM0_Da;
    local_188 = in_XMM1_Qa;
    local_178 = in_XMM2_Qa;
    local_168 = in_XMM3_Qa;
    local_158 = in_XMM4_Qa;
    local_148 = in_XMM5_Qa;
    local_138 = in_XMM6_Qa;
    local_128 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = local_1c8;
  args[0]._0_8_ = &stack0x00000008;
  uStack_34 = 0x30;
  uStack_38 = 0x10;
  fixed_buf[0x78] = '\x10';
  fixed_buf[0x79] = '\0';
  fixed_buf[0x7a] = '\0';
  fixed_buf[0x7b] = '\0';
  fixed_buf[0x7c] = '0';
  fixed_buf[0x7d] = '\0';
  fixed_buf[0x7e] = '\0';
  fixed_buf[0x7f] = '\0';
  length = (size_t)&buffer;
  uStack_200 = 0x13a207;
  local_1d0 = this;
  local_1b8 = in_RDX;
  local_1b0 = in_RCX;
  local_1a8 = in_R8;
  local_1a0 = in_R9;
  iVar6 = vsnprintf((char *)&buffer,0x80,format,&uStack_38);
  local_e8 = (long)iVar6;
  if (0x80 < local_e8 + 1U) {
    lVar3 = -(local_e8 + 0x10U & 0xfffffffffffffff0);
    __s = acStack_1f8 + lVar3;
    __maxlen = local_e8 + 1;
    length = (size_t)__s;
    *(undefined8 *)((long)&uStack_200 + lVar3) = 0x13a265;
    iVar6 = vsnprintf(__s,__maxlen,format,fixed_buf + 0x78);
    local_e8 = (long)iVar6;
  }
  local_1e8 = _stderr;
  local_1f0 = &(local_1d0->loc_).filename;
  local_1d8 = &local_109;
  __s[-8] = -0x5c;
  __s[-7] = -0x5e;
  __s[-6] = '\x13';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::allocator<char>::allocator();
  paVar4 = local_1d8;
  __t = local_1f0;
  local_1e0 = local_108;
  builtin_strncpy(__s + -8,"Ţ\x13",4);
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_108,__t,paVar4);
  builtin_strncpy(__s + -8,"Ѣ\x13",4);
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  uVar7 = std::__cxx11::string::c_str();
  sVar5 = length;
  __stream = local_1e8;
  uVar1 = (local_1d0->loc_).field_1.field_0.line;
  uVar2 = (local_1d0->loc_).field_1.field_0.first_column;
  __s[-8] = -2;
  __s[-7] = -0x5e;
  __s[-6] = '\x13';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  fprintf(__stream,"%s:%d:%d: %s\n",uVar7,(ulong)uVar1,(ulong)uVar2,sVar5);
  this_00 = local_1e0;
  __s[-8] = '\n';
  __s[-7] = -0x5d;
  __s[-6] = '\x13';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::__cxx11::string::~string(this_00);
  paVar4 = local_1d8;
  __s[-8] = '\x16';
  __s[-7] = -0x5d;
  __s[-6] = '\x13';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::allocator<char>::~allocator(paVar4);
  return;
}

Assistant:

void JSONParser::PrintError(const char* format, ...) {
  WABT_SNPRINTF_ALLOCA(buffer, length, format);
  fprintf(stderr, "%s:%d:%d: %s\n", std::string(loc_.filename).c_str(),
          loc_.line, loc_.first_column, buffer);
}